

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O2

void __thiscall
duckdb::SimpleBufferedData::SimpleBufferedData
          (SimpleBufferedData *this,weak_ptr<duckdb::ClientContext,_true> *context)

{
  weak_ptr<duckdb::ClientContext,_true> local_28;
  
  local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BufferedData::BufferedData(&this->super_BufferedData,SIMPLE,&local_28);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_BufferedData)._vptr_BufferedData = (_func_int **)&PTR__SimpleBufferedData_017a87c0;
  ::std::
  queue<duckdb::InterruptState,std::deque<duckdb::InterruptState,std::allocator<duckdb::InterruptState>>>
  ::queue<std::deque<duckdb::InterruptState,std::allocator<duckdb::InterruptState>>,void>
            (&this->blocked_sinks);
  ::std::
  queue<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>>
  ::
  queue<std::deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>,void>
            (&this->buffered_chunks);
  LOCK();
  (this->buffered_count).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  this->buffer_size = (this->super_BufferedData).total_buffer_size;
  return;
}

Assistant:

SimpleBufferedData::SimpleBufferedData(weak_ptr<ClientContext> context)
    : BufferedData(BufferedData::Type::SIMPLE, std::move(context)) {
	buffered_count = 0;
	buffer_size = total_buffer_size;
}